

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O2

void Gia_ManPatchBufDriver(Gia_Man_t *p,int iBuf,int iLit0)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pObj;
  
  pObj = Gia_ManObj(p,iBuf);
  iVar1 = Gia_ObjIsBuf(pObj);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsBuf(pObjBuf)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieGia.c"
                  ,0x113,"void Gia_ManPatchBufDriver(Gia_Man_t *, int, int)");
  }
  iVar1 = Gia_ObjId(p,pObj);
  if (0 < iVar1) {
    uVar2 = Gia_ObjId(p,pObj);
    *(ulong *)pObj =
         (ulong)(uVar2 & 0x1fffffff) << 0x20 | *(ulong *)pObj & 0xc0000000c0000000 |
         (ulong)(uVar2 & 0x1fffffff);
    return;
  }
  __assert_fail("Gia_ObjId(p, pObjBuf) > Abc_Lit2Var(iLit0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieGia.c"
                ,0x114,"void Gia_ManPatchBufDriver(Gia_Man_t *, int, int)");
}

Assistant:

static inline void Gia_ManPatchBufDriver( Gia_Man_t * p, int iBuf, int iLit0 )  
{
    Gia_Obj_t * pObjBuf  = Gia_ManObj( p, iBuf );
    assert( Gia_ObjIsBuf(pObjBuf) );
    assert( Gia_ObjId(p, pObjBuf) > Abc_Lit2Var(iLit0) );
    pObjBuf->iDiff1  = pObjBuf->iDiff0  = Gia_ObjId(p, pObjBuf) - Abc_Lit2Var(iLit0);
    pObjBuf->fCompl1 = pObjBuf->fCompl0 = Abc_LitIsCompl(iLit0);
}